

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

wasm_val_t FromWabtValue(Store *store,TypedValue *tv)

{
  Enum EVar1;
  uint uVar2;
  Ref RVar3;
  FILE *__stream;
  undefined7 uVar5;
  undefined8 uVar4;
  wasm_func_t *this;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  TypedValue *in_RDX;
  ulong uVar6;
  wasm_val_t wVar7;
  RefPtr<wabt::interp::Foreign> RStack_78;
  RefPtr<wabt::interp::Func> local_60;
  string local_48;
  
  __stream = _stderr;
  wabt::interp::TypedValueToString_abi_cxx11_(&local_48,(interp *)tv,in_RDX);
  fprintf(__stream,"CAPI: [%s] %s\n","FromWabtValue",local_48._M_dataplus._M_p);
  std::__cxx11::string::_M_dispose();
  EVar1 = (tv->type).enum_;
  uVar5 = (undefined7)
          ((ulong)((long)&switchD_001bde2a::switchdataD_001e9ff4 +
                  (long)(int)(&switchD_001bde2a::switchdataD_001e9ff4)[(uint)(EVar1 + I8U)]) >> 8);
  switch(EVar1) {
  case F64:
    this = (wasm_func_t *)(tv->value).field_0.i64_;
    uVar6 = (ulong)this & 0xffffffff00000000;
    uVar4 = CONCAT71(uVar5,3);
    break;
  case F32:
    uVar2 = (tv->value).field_0.i32_;
    uVar4 = CONCAT71(uVar5,2);
    goto LAB_001bdefd;
  case I64:
    this = (wasm_func_t *)(tv->value).field_0.i64_;
    uVar6 = (ulong)this & 0xffffffff00000000;
    uVar4 = CONCAT71(uVar5,1);
    break;
  case I32:
    uVar2 = (tv->value).field_0.i32_;
    uVar4 = 0;
LAB_001bdefd:
    this = (wasm_func_t *)(ulong)uVar2;
    uVar6 = 0;
    break;
  default:
    if (EVar1 == ExternRef) {
      RVar3.index = (tv->value).field_0.ref_.index;
      this = (wasm_func_t *)operator_new(0x18);
      wabt::interp::RefPtr<wabt::interp::Foreign>::RefPtr(&RStack_78,store,RVar3);
      wasm_foreign_t::wasm_foreign_t((wasm_foreign_t *)this,&RStack_78);
      uVar6 = (ulong)this & 0xffffffff00000000;
      wabt::interp::RefPtr<wabt::interp::Foreign>::reset(&RStack_78);
      uVar4 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),0x80);
    }
    else {
      if (EVar1 != FuncRef) {
        fprintf(_stderr,"CAPI: [%s] unexpected wabt type: %d\n","FromWabtValue");
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp-wasm-c-api.cc"
                      ,0x1d6,"wasm_val_t FromWabtValue(Store &, const TypedValue &)");
      }
      RVar3.index = (tv->value).field_0.ref_.index;
      this = (wasm_func_t *)operator_new(0x18);
      wabt::interp::RefPtr<wabt::interp::Func>::RefPtr(&local_60,store,RVar3);
      wasm_func_t::wasm_func_t(this,&local_60);
      uVar6 = (ulong)this & 0xffffffff00000000;
      wabt::interp::RefPtr<wabt::interp::Func>::reset(&local_60);
      uVar4 = CONCAT71((int7)((ulong)extraout_RAX >> 8),0x81);
    }
  }
  wVar7.of.i64 = (ulong)this & 0xffffffff | uVar6;
  wVar7._0_8_ = uVar4;
  return wVar7;
}

Assistant:

static wasm_val_t FromWabtValue(Store& store, const TypedValue& tv) {
  TRACE("%s", TypedValueToString(tv).c_str());
  wasm_val_t out_value;
  switch (tv.type) {
    case Type::I32:
      out_value.kind = WASM_I32;
      out_value.of.i32 = tv.value.Get<s32>();
      break;
    case Type::I64:
      out_value.kind = WASM_I64;
      out_value.of.i64 = tv.value.Get<s64>();
      break;
    case Type::F32:
      out_value.kind = WASM_F32;
      out_value.of.f32 = tv.value.Get<f32>();
      break;
    case Type::F64:
      out_value.kind = WASM_F64;
      out_value.of.f64 = tv.value.Get<f64>();
      break;
    case Type::FuncRef: {
      Ref ref = tv.value.Get<Ref>();
      out_value.kind = WASM_FUNCREF;
      out_value.of.ref = new wasm_func_t(store.UnsafeGet<Func>(ref));
      break;
    }
    case Type::ExternRef: {
      Ref ref = tv.value.Get<Ref>();
      out_value.kind = WASM_ANYREF;
      out_value.of.ref = new wasm_foreign_t(store.UnsafeGet<Foreign>(ref));
      break;
    }
    default:
      TRACE("unexpected wabt type: %d", static_cast<int>(tv.type));
      assert(false);
  }
  return out_value;
}